

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

string * __thiscall
toml::format<char_const*,char_const(&)[15]>
          (string *__return_storage_ptr__,toml *this,stringstream *ss,char **t,char (*args) [15])

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  char (*pacVar3) [15];
  
  poVar1 = (ostream *)(this + 0x10);
  __s = *(char **)ss;
  pacVar3 = (char (*) [15])t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  format<char_const(&)[15]>(__return_storage_ptr__,this,(stringstream *)t,pacVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}